

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O2

void test_bson_json_number_long_zero(void)

{
  char cVar1;
  int iVar2;
  long lVar3;
  undefined8 uVar4;
  char *pcVar5;
  bson_iter_t iter;
  bson_t b;
  bson_error_t error;
  undefined1 auStack_400 [128];
  undefined1 local_380 [232];
  undefined1 local_298 [8];
  undefined1 local_290 [640];
  
  cVar1 = bson_init_from_json(local_380,"{ \"key\": { \"$numberLong\": \"0\" }}",0xffffffffffffffff,
                              local_298);
  if (cVar1 == '\0') {
    fprintf(_stderr,"%s\n",local_290);
    pcVar5 = "r";
    uVar4 = 0x60f;
  }
  else {
    cVar1 = bson_iter_init(auStack_400,local_380);
    if (cVar1 == '\0') {
      pcVar5 = "bson_iter_init (&iter, &b)";
      uVar4 = 0x610;
    }
    else {
      cVar1 = bson_iter_find(auStack_400,"key");
      if (cVar1 == '\0') {
        pcVar5 = "bson_iter_find (&iter, \"key\")";
        uVar4 = 0x611;
      }
      else {
        iVar2 = bson_iter_type(auStack_400);
        if (iVar2 == 0x12) {
          lVar3 = bson_iter_int64(auStack_400);
          if (lVar3 == 0) {
            bson_destroy(local_380);
            return;
          }
          pcVar5 = "bson_iter_int64 (&iter) == 0";
          uVar4 = 0x613;
        }
        else {
          pcVar5 = "BSON_ITER_HOLDS_INT64 (&iter)";
          uVar4 = 0x612;
        }
      }
    }
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
          uVar4,"test_bson_json_number_long_zero",pcVar5);
  abort();
}

Assistant:

static void
test_bson_json_number_long_zero (void)
{
   bson_error_t error;
   bson_iter_t iter;
   const char *json = "{ \"key\": { \"$numberLong\": \"0\" }}";
   bson_t b;
   bool r;

   r = bson_init_from_json (&b, json, -1, &error);
   if (!r)
      fprintf (stderr, "%s\n", error.message);
   BSON_ASSERT (r);
   BSON_ASSERT (bson_iter_init (&iter, &b));
   BSON_ASSERT (bson_iter_find (&iter, "key"));
   BSON_ASSERT (BSON_ITER_HOLDS_INT64 (&iter));
   BSON_ASSERT (bson_iter_int64 (&iter) == 0);
   bson_destroy (&b);
}